

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdAddd(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  bool bVar1;
  x86XmmReg xVar2;
  x86XmmReg local_1c;
  x86XmmReg rhs;
  x86XmmReg lhs;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._2_1_ = cmd.rB;
  local_1c = CodeGenGenericContext::FindXmmRegAtMemory
                       (&ctx->ctx,sQWORD,rNONE,1,rEBX,(uint)ctx_local._2_1_ << 3,true);
  if (local_1c == rXmmRegCount) {
    local_1c = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,local_1c,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  }
  else {
    CodeGenGenericContext::LockXmmReg(&ctx->ctx,local_1c);
  }
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  if (((ctx_local._3_1_ == '\x03') &&
      (bVar1 = CodeGenGenericContext::IsLastRegVmRegisterUse
                         (&ctx->ctx,(uchar)(ctx_local._4_4_ >> 3),
                          ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset), bVar1)) &&
     (xVar2 = CodeGenGenericContext::FindXmmRegAtMemory
                        (&ctx->ctx,sQWORD,rNONE,1,rEBX,ctx_local._4_4_,true), xVar2 == rXmmRegCount)
     ) {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_addsd,local_1c,sQWORD,rEBX,ctx_local._4_4_);
  }
  else {
    xVar2 = GenCodeLoadDoubleFromPointerIntoRegister(ctx,rEAX,ctx_local._3_1_,ctx_local._4_4_);
    EMIT_OP_REG_REG(&ctx->ctx,o_addsd,local_1c,xVar2);
  }
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,local_1c);
  return;
}

Assistant:

void GenCodeCmdAddd(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	x86XmmReg lhs = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rB * 8, true);

	if(lhs == rXmmRegCount)
	{
		lhs = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, lhs, sQWORD, rREG, cmd.rB * 8); // Load double value
	}
	else
	{
		ctx.ctx.LockXmmReg(lhs);
	}

	if(cmd.rC == rvrrRegisters && ctx.ctx.IsLastRegVmRegisterUse((unsigned char)(cmd.argument / 8), ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset) && ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.argument, true) == rXmmRegCount)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_addsd, lhs, sQWORD, rREG, cmd.argument);
	}
	else
	{
		x86XmmReg rhs = GenCodeLoadDoubleFromPointerIntoRegister(ctx, rRAX, cmd.rC, cmd.argument);

		EMIT_OP_REG_REG(ctx.ctx, o_addsd, lhs, rhs);
	}

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, cmd.rA * 8, lhs); // Store double to target
}